

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

bool __thiscall
ONX_Model::Read(ONX_Model *this,ON_BinaryArchive *archive,uint table_filter,
               uint model_object_type_filter,ON_TextLog *error_log)

{
  bool bVar1;
  uint uVar2;
  int archive_3dm_version;
  ON_ModelComponentReference model_geometry_reference;
  ON_ModelComponentReference local_40;
  
  IncrementalReadBegin(this,archive,true,table_filter,error_log);
  uVar2 = ON_BinaryArchive::CriticalErrorCount(archive);
  if (uVar2 == 0) {
    if (-1 < (short)table_filter) {
      do {
        ON_ModelComponentReference::ON_ModelComponentReference(&local_40);
        error_log = (ON_TextLog *)0x1;
        bVar1 = IncrementalReadModelGeometry
                          (this,archive,true,true,true,model_object_type_filter,&local_40);
        if (!bVar1) {
          ON_ModelComponentReference::~ON_ModelComponentReference(&local_40);
          break;
        }
        bVar1 = ON_ModelComponentReference::IsEmpty(&local_40);
        ON_ModelComponentReference::~ON_ModelComponentReference(&local_40);
      } while (!bVar1);
      uVar2 = ON_BinaryArchive::CriticalErrorCount(archive);
      if (uVar2 != 0) {
        return false;
      }
    }
    IncrementalReadFinish(this,archive,true,table_filter,error_log);
    uVar2 = ON_BinaryArchive::CriticalErrorCount(archive);
    if ((uVar2 == 0) && (uVar2 = ON_BinaryArchive::BadCRCCount(archive), uVar2 == 0)) {
      archive_3dm_version = ON_BinaryArchive::Archive3dmVersion(archive);
      ONX_ModelPrivate::PopulateRDKComponents(this->m_private,archive_3dm_version);
      return true;
    }
  }
  return false;
}

Assistant:

bool ONX_Model::Read(ON_BinaryArchive& archive, unsigned int table_filter,
                     unsigned int model_object_type_filter, ON_TextLog* error_log)
{
  // STEPS 1 to 14: REQUIRED.
  const bool bManageComponents = true;
  IncrementalReadBegin(archive, bManageComponents, table_filter, error_log);
  if (0 != archive.CriticalErrorCount())
    return false;

  // STEP 15: REQUIRED - Read object (geometry and annotation) table.
  if (0 == (static_cast<unsigned int>(ON_3dmArchiveTableType::object_table) & table_filter))
  {
    const bool bManageGeometry = true;
    const bool bManageAttributes = true;
    for (;;)
    {
      ON_ModelComponentReference model_geometry_reference;

      if (!IncrementalReadModelGeometry(archive, bManageComponents, bManageGeometry, bManageAttributes,
        model_object_type_filter, model_geometry_reference))
      {
        // Catastrophic error.
        break; 
      }

      if (model_geometry_reference.IsEmpty())
        break; // No more geometry.
    }

    if (0 != archive.CriticalErrorCount())
      return false;
  }

  IncrementalReadFinish(archive, bManageComponents, table_filter, error_log);
  if (0 != archive.CriticalErrorCount())
    return false;

  if (0 != archive.BadCRCCount())
    return false;

  // Having read the model data, populate the RDK components.
  const int archive_3dm_version = archive.Archive3dmVersion();
  m_private->PopulateRDKComponents(archive_3dm_version);

  return true;
}